

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O1

void test_maximal_dimension<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>
               (Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>
                *m)

{
  Underlying_matrix *this;
  ID_index IVar1;
  logic_error *this_00;
  undefined4 local_150;
  int local_14c;
  undefined4 *local_148;
  int *local_140;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> local_138;
  undefined8 *local_128;
  undefined4 **local_120;
  undefined1 local_118;
  undefined8 local_110;
  shared_count sStack_108;
  pair<unsigned_int,_unsigned_int> local_100;
  ulong uStack_f8;
  undefined8 *local_f0;
  int **ppiStack_e8;
  undefined4 local_e0;
  undefined4 uStack_dc;
  undefined4 uStack_d8;
  undefined4 uStack_d4;
  char *local_d0;
  char *local_c8;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_c0;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_a8;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined **local_70;
  undefined1 local_68;
  undefined8 *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x39f);
  local_68 = 0;
  local_70 = &PTR__lazy_ostream_00241048;
  local_60 = &boost::unit_test::lazy_ostream::inst;
  local_58 = "";
  local_14c = (m->matrix_).super_Matrix_dimension_option.maxDim_;
  local_140 = &local_14c;
  local_148 = &local_150;
  local_150 = 2;
  local_118 = local_14c == 2;
  local_110 = 0;
  sStack_108.pi_ = (sp_counted_base *)0x0;
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_c8 = "";
  ppiStack_e8 = &local_140;
  uStack_f8 = uStack_f8 & 0xffffffffffffff00;
  local_100 = (pair<unsigned_int,_unsigned_int>)&PTR__lazy_ostream_00241008;
  local_f0 = &boost::unit_test::lazy_ostream::inst;
  local_138._M_len = local_138._M_len & 0xffffffffffffff00;
  local_120 = &local_148;
  local_138._M_array = (iterator)&PTR__lazy_ostream_00241008;
  local_128 = &boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_108);
  local_100.first = 0;
  local_100.second = 1;
  uStack_f8 = 0x400000001;
  local_f0 = (undefined8 *)0x100000002;
  ppiStack_e8 = (int **)0x400000003;
  local_e0 = 4;
  uStack_dc = 1;
  uStack_d8 = 5;
  uStack_d4 = 4;
  local_138._M_len = 6;
  local_138._M_array = &local_100;
  if ((m->colSettings_->operators).characteristic_ == 0xffffffff) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              (this_00,
               "Matrix::insert_boundary - Columns cannot be initialized if the coefficient field characteristic is not specified."
              );
  }
  else {
    IVar1 = (m->matrix_).nextIndex_;
    this = &m->matrix_;
    Gudhi::persistence_matrix::Matrix_all_dimension_holder<int>::update_up
              (&this->super_Matrix_dimension_option,5);
    Gudhi::persistence_matrix::
    Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>
    ::_reduce_boundary<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
              (&local_a8,
               (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>
                *)this,IVar1,&local_138,-1);
    if (local_a8.
        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a8.
                      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_a8.
                            super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_a8.
                            super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    local_100.first = 0;
    local_100.second = 1;
    uStack_f8 = 0x400000001;
    local_f0 = (undefined8 *)0x100000002;
    ppiStack_e8 = (int **)0x400000003;
    local_138._M_len = 4;
    if ((m->colSettings_->operators).characteristic_ != 0xffffffff) {
      IVar1 = (m->matrix_).nextIndex_;
      local_138._M_array = &local_100;
      Gudhi::persistence_matrix::Matrix_all_dimension_holder<int>::update_up
                (&this->super_Matrix_dimension_option,3);
      Gudhi::persistence_matrix::
      Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>
      ::_reduce_boundary<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
                (&local_c0,
                 (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>
                  *)this,IVar1,&local_138,-1);
      if (local_c0.
          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_c0.
                        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_c0.
                              super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_c0.
                              super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      local_80 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
      ;
      local_78 = "";
      local_90 = &boost::unit_test::basic_cstring<char_const>::null;
      local_88 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x3a9);
      local_68 = 0;
      local_70 = &PTR__lazy_ostream_00241048;
      local_60 = &boost::unit_test::lazy_ostream::inst;
      local_58 = "";
      local_14c = (m->matrix_).super_Matrix_dimension_option.maxDim_;
      local_118 = local_14c == 5;
      local_150 = 5;
      local_110 = 0;
      sStack_108.pi_ = (sp_counted_base *)0x0;
      local_d0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
      ;
      local_c8 = "";
      local_140 = &local_14c;
      uStack_f8 = uStack_f8 & 0xffffffffffffff00;
      local_100 = (pair<unsigned_int,_unsigned_int>)&PTR__lazy_ostream_00241008;
      local_f0 = &boost::unit_test::lazy_ostream::inst;
      ppiStack_e8 = &local_140;
      local_148 = &local_150;
      local_138._M_len = local_138._M_len & 0xffffffffffffff00;
      local_138._M_array = (iterator)&PTR__lazy_ostream_00241008;
      local_128 = &boost::unit_test::lazy_ostream::inst;
      local_120 = &local_148;
      boost::test_tools::tt_detail::report_assertion();
      boost::detail::shared_count::~shared_count(&sStack_108);
      return;
    }
    local_138._M_array = &local_100;
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              (this_00,
               "Matrix::insert_boundary - Columns cannot be initialized if the coefficient field characteristic is not specified."
              );
  }
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void test_maximal_dimension(Matrix& m) {
  BOOST_CHECK_EQUAL(m.get_max_dimension(), 2);

  if constexpr (Matrix::Option_list::is_z2) {
    m.insert_boundary({0, 1, 2, 3, 4, 5});
    m.insert_boundary({0, 1, 2, 3});
  } else {
    m.insert_boundary({{0, 1}, {1, 4}, {2, 1}, {3, 4}, {4, 1}, {5, 4}});
    m.insert_boundary({{0, 1}, {1, 4}, {2, 1}, {3, 4}});
  }

  BOOST_CHECK_EQUAL(m.get_max_dimension(), 5);

  if constexpr (Matrix::Option_list::has_vine_update &&
                (Matrix::Option_list::is_of_boundary_type ||
                 (Matrix::Option_list::has_map_column_container && Matrix::Option_list::has_column_pairings))) {
    m.remove_maximal_cell(7);
    BOOST_CHECK_EQUAL(m.get_max_dimension(), 3);
  }
}